

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O3

SegmentBuilder * __thiscall
capnp::_::BuilderArena::addSegmentInternal<capnp::word>
          (BuilderArena *this,ArrayPtr<capnp::word> content)

{
  MultiSegmentState *this_00;
  SegmentBuilder *pSVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  ArrayPtr<const_capnp::word> *pAVar3;
  long lVar4;
  MultiSegmentState *ptrCopy;
  RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *pRVar5;
  size_t newSize;
  ulong newSize_00;
  RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *pRVar6;
  ulong uVar7;
  SegmentBuilder *ptrCopy_1;
  Fault f;
  Fault local_48;
  Exception *local_40;
  word *local_38;
  
  local_48.exception = (Exception *)content.size_;
  local_38 = content.ptr;
  if ((this->segment0).super_SegmentReader.arena == (Arena *)0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[69]>
              (&local_48,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/arena.c++"
               ,0xe6,FAILED,"segment0.getArena() != nullptr",
               "\"Can\'t allocate external segments before allocating the root segment.\"",
               (char (*) [69])
               "Can\'t allocate external segments before allocating the root segment.");
    kj::_::Debug::Fault::fatal(&local_48);
  }
  if ((Exception *)0x1fffffff < local_48.exception) {
    anon_func::anon_class_8_1_89918cff::operator()((anon_class_8_1_89918cff *)&local_48);
  }
  this_00 = (this->moreSegments).ptr.ptr;
  local_40 = local_48.exception;
  if (this_00 == (MultiSegmentState *)0x0) {
    this_00 = (MultiSegmentState *)operator_new(0x40);
    (this_00->builders).builder.ptr = (Own<capnp::_::SegmentBuilder> *)0x0;
    (this_00->builders).builder.pos = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
    (this_00->builders).builder.endPtr = (Own<capnp::_::SegmentBuilder> *)0x0;
    (this_00->builders).builder.disposer = (ArrayDisposer *)0x0;
    (this_00->forOutput).builder.ptr = (ArrayPtr<const_capnp::word> *)0x0;
    (this_00->forOutput).builder.pos = (RemoveConst<kj::ArrayPtr<const_capnp::word>_> *)0x0;
    (this_00->forOutput).builder.endPtr = (ArrayPtr<const_capnp::word> *)0x0;
    (this_00->forOutput).builder.disposer = (ArrayDisposer *)0x0;
    (this->moreSegments).ptr.disposer =
         (Disposer *)&kj::_::HeapDisposer<capnp::_::BuilderArena::MultiSegmentState>::instance;
    (this->moreSegments).ptr.ptr = this_00;
    pRVar5 = (RemoveConst<kj::Own<capnp::_::SegmentBuilder>_> *)0x0;
  }
  else {
    pRVar5 = (this_00->builders).builder.ptr;
  }
  pRVar6 = (this_00->builders).builder.pos;
  pSVar1 = (SegmentBuilder *)operator_new(0x38);
  (pSVar1->super_SegmentReader).arena = &this->super_Arena;
  (pSVar1->super_SegmentReader).id.value = (int)((ulong)((long)pRVar6 - (long)pRVar5) >> 4) + 1;
  (pSVar1->super_SegmentReader).ptr.ptr = local_38;
  (pSVar1->super_SegmentReader).ptr.size_ = (size_t)local_40;
  (pSVar1->super_SegmentReader).readLimiter = &this->dummyLimiter;
  pSVar1->pos = local_38;
  pSVar1->readOnly = false;
  pRVar6 = (this_00->builders).builder.pos;
  if (pRVar6 == (this_00->builders).builder.endPtr) {
    newSize = 4;
    if (pRVar6 != pRVar5) {
      newSize = (long)pRVar6 - (long)pRVar5 >> 3;
    }
    kj::Vector<kj::Own<capnp::_::SegmentBuilder>_>::setCapacity(&this_00->builders,newSize);
    pRVar5 = (this_00->builders).builder.ptr;
    pRVar6 = (this_00->builders).builder.pos;
  }
  pRVar6->disposer = (Disposer *)&kj::_::HeapDisposer<capnp::_::SegmentBuilder>::instance;
  pRVar6->ptr = pSVar1;
  (this_00->builders).builder.pos = pRVar6 + 1;
  uVar7 = ((long)(pRVar6 + 1) - (long)pRVar5 >> 4) + 1;
  pAVar2 = (this_00->forOutput).builder.ptr;
  pAVar3 = (this_00->forOutput).builder.endPtr;
  lVar4 = (long)pAVar3 - (long)pAVar2;
  if ((ulong)(lVar4 >> 4) < uVar7) {
    newSize_00 = 4;
    if (pAVar3 != pAVar2) {
      newSize_00 = lVar4 >> 3;
    }
    if (newSize_00 < uVar7) {
      newSize_00 = uVar7;
    }
    kj::Vector<kj::ArrayPtr<const_capnp::word>_>::setCapacity(&this_00->forOutput,newSize_00);
    pAVar2 = (this_00->forOutput).builder.ptr;
  }
  pAVar2 = pAVar2 + uVar7;
  pAVar3 = (this_00->forOutput).builder.pos;
  if (pAVar3 < pAVar2) {
    do {
      (this_00->forOutput).builder.pos = pAVar3 + 1;
      pAVar3->ptr = (word *)0x0;
      pAVar3->size_ = 0;
      pAVar3 = (this_00->forOutput).builder.pos;
    } while (pAVar3 < pAVar2);
  }
  else {
    (this_00->forOutput).builder.pos = pAVar2;
  }
  return pSVar1;
}

Assistant:

SegmentBuilder* BuilderArena::addSegmentInternal(kj::ArrayPtr<T> content) {
  // This check should never fail in practice, since you can't get an Orphanage without allocating
  // the root segment.
  KJ_REQUIRE(segment0.getArena() != nullptr,
      "Can't allocate external segments before allocating the root segment.");

  auto contentSize = verifySegmentSize(content.size());

  MultiSegmentState* segmentState;
  KJ_IF_MAYBE(s, moreSegments) {
    segmentState = *s;
  } else {
    auto newSegmentState = kj::heap<MultiSegmentState>();
    segmentState = newSegmentState;
    moreSegments = kj::mv(newSegmentState);
  }